

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsGramNode * __thiscall CTcPrsGramNodeCat::clone_expansion(CTcPrsGramNodeCat *this)

{
  CTcPrsGramNodeWithChildren *__s;
  CTcPrsGramNode *sub;
  long in_RDI;
  CTcPrsGramNode *cur;
  CTcPrsGramNodeCat *new_cat;
  CTcPrsMem *in_stack_ffffffffffffffc8;
  CTcPrsGramNodeCat *in_stack_ffffffffffffffd0;
  CTcPrsGramNodeWithChildren *this_00;
  long *local_18;
  
  __s = (CTcPrsGramNodeWithChildren *)
        operator_new((size_t)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  memset(__s,0,0x58);
  CTcPrsGramNodeCat(in_stack_ffffffffffffffd0);
  for (local_18 = *(long **)(in_RDI + 0x40); local_18 != (long *)0x0; local_18 = (long *)local_18[7]
      ) {
    this_00 = __s;
    sub = (CTcPrsGramNode *)(**(code **)(*local_18 + 0x50))();
    CTcPrsGramNodeWithChildren::add_sub_item(this_00,sub);
  }
  return &__s->super_CTcPrsGramNode;
}

Assistant:

virtual CTcPrsGramNode *clone_expansion() const
    {
        /* create a new 'cat' node */
        CTcPrsGramNodeCat *new_cat = new (G_prsmem) CTcPrsGramNodeCat();

        /* add a clone of each of my children and add it to my replica */
        for (CTcPrsGramNode *cur = sub_head_ ; cur != 0 ; cur = cur->next_)
            new_cat->add_sub_item(cur->clone_expansion());

        /* return my replica */
        return new_cat;
    }